

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.h
# Opt level: O0

LastLevelTable * __thiscall
GmmLib::MidLevelTable::GetL1Table(MidLevelTable *this,GMM_GFX_SIZE_T L2eIdx,LastLevelTable **Prev)

{
  int iVar1;
  LastLevelTable **ppLVar2;
  LastLevelTable *local_30;
  LastLevelTable *PrevL1Tbl;
  LastLevelTable *pL1Tbl;
  LastLevelTable **Prev_local;
  GMM_GFX_SIZE_T L2eIdx_local;
  MidLevelTable *this_local;
  
  PrevL1Tbl = this->pTTL1;
  local_30 = (LastLevelTable *)0x0;
  while ((PrevL1Tbl != (LastLevelTable *)0x0 &&
         (iVar1 = LastLevelTable::GetL2eIdx(PrevL1Tbl), (long)iVar1 != L2eIdx))) {
    local_30 = PrevL1Tbl;
    ppLVar2 = LastLevelTable::Next(PrevL1Tbl);
    PrevL1Tbl = *ppLVar2;
  }
  if (Prev != (LastLevelTable **)0x0) {
    *Prev = local_30;
  }
  return PrevL1Tbl;
}

Assistant:

LastLevelTable* GetL1Table(GMM_GFX_SIZE_T L2eIdx, LastLevelTable** Prev = NULL)
        {
            LastLevelTable* pL1Tbl = pTTL1;
            LastLevelTable* PrevL1Tbl = NULL;

            while (pL1Tbl)
            {
                if (pL1Tbl->GetL2eIdx() == L2eIdx)
                {
                    break;
                }
                PrevL1Tbl = pL1Tbl;
                pL1Tbl = pL1Tbl->Next();
            }

            //if requested, save previous node in linked-list
            if (Prev)
            {
                *Prev = PrevL1Tbl;
            }
            return pL1Tbl;
        }